

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  int iVar1;
  uint uVar2;
  int overflow;
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  unsigned_long _zzq_args [6];
  int local_80;
  uint local_7c;
  undefined8 local_78;
  uint local_70;
  secp256k1_scalar local_6c [3];
  secp256k1_scalar *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_80 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_3();
  }
  else if (seckey != (uchar *)0x0) {
    if (tweak32 == (uchar *)0x0) {
      secp256k1_ec_seckey_tweak_mul_cold_1();
      return 0;
    }
    secp256k1_scalar_set_b32(local_6c,tweak32,&local_80);
    uVar2 = secp256k1_scalar_set_b32_seckey(&local_70,seckey);
    iVar1 = local_80;
    secp256k1_scalar_verify(local_6c);
    if (local_6c[0] == 0) {
      uVar2 = 0;
    }
    if (iVar1 != 0) {
      uVar2 = 0;
    }
    secp256k1_scalar_mul(&local_70,&local_70,local_6c);
    local_7c = uVar2 ^ 1;
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    local_6c[1] = 0x4d430005;
    local_6c[2] = 0;
    local_58 = 4;
    local_50 = 0;
    local_48 = 0;
    local_40 = 0;
    local_78 = 0;
    local_70 = local_70 & local_7c - 1;
    local_60 = &local_70;
    secp256k1_scalar_verify(&local_70);
    secp256k1_scalar_verify(&local_70);
    seckey[0x10] = '\0';
    seckey[0x11] = '\0';
    seckey[0x12] = '\0';
    seckey[0x13] = '\0';
    seckey[0x14] = '\0';
    seckey[0x15] = '\0';
    seckey[0x16] = '\0';
    seckey[0x17] = '\0';
    seckey[0x18] = '\0';
    seckey[0x19] = '\0';
    seckey[0x1a] = '\0';
    seckey[0x1b] = '\0';
    seckey[0x1c] = '\0';
    seckey[0x1d] = '\0';
    seckey[0x1e] = '\0';
    seckey[0x1f] = '\0';
    seckey[0] = '\0';
    seckey[1] = '\0';
    seckey[2] = '\0';
    seckey[3] = '\0';
    seckey[4] = '\0';
    seckey[5] = '\0';
    seckey[6] = '\0';
    seckey[7] = '\0';
    seckey[8] = '\0';
    seckey[9] = '\0';
    seckey[10] = '\0';
    seckey[0xb] = '\0';
    seckey[0xc] = '\0';
    seckey[0xd] = '\0';
    seckey[0xe] = '\0';
    seckey[0xf] = '\0';
    *(uint *)(seckey + 0x1c) =
         local_70 >> 0x18 | (local_70 & 0xff0000) >> 8 | (local_70 & 0xff00) << 8 | local_70 << 0x18
    ;
    return uVar2;
  }
  secp256k1_ec_seckey_tweak_mul_cold_2();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}